

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O2

void __thiscall
USBHidRepDescItemFrame::PackFrame
          (USBHidRepDescItemFrame *this,U8 *pItem,U16 indentLevel,U16 usagePage)

{
  byte bVar1;
  undefined6 in_register_00000012;
  
  bVar1 = 5;
  if ((*pItem & 3) != 3) {
    bVar1 = (*pItem & 3) + 1;
  }
  memcpy(&this->field_0x10,pItem,(ulong)bVar1);
  *(ulong *)&this->field_0x18 =
       (ulong)((uint)usagePage << 0x10 | (uint)CONCAT62(in_register_00000012,indentLevel));
  return;
}

Assistant:

void USBHidRepDescItemFrame::PackFrame( const U8* pItem, U16 indentLevel, U16 usagePage )
{
    // mData1 contains the 1 to 5 bytes of the HID item
    U8 itemSize = GetNumHIDItemDataBytes( pItem[ 0 ] ) + 1;
    memcpy( &mData1, pItem, itemSize );

    // mData2 format:
    //
    // 66665555 55555544 44444444 33333333 33222222 22221111 11111100 00000000
    // 32109876 54321098 76543210 98765432 10987654 32109876 54321098 76543210
    // ----------------- ----------------- ----usagePage---- ---indentLevel---

    // contains indentLevel and usagePage
    mData2 = usagePage;
    mData2 <<= 16;
    mData2 |= indentLevel;
}